

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O2

REF_STATUS ref_adj_min_degree_node(REF_ADJ ref_adj,REF_INT *min_degree,REF_INT *min_degree_node)

{
  int node;
  REF_INT degree;
  int local_2c;
  
  *min_degree = -1;
  *min_degree_node = -1;
  for (node = 0; node < ref_adj->nnode; node = node + 1) {
    ref_adj_degree(ref_adj,node,&local_2c);
    if ((0 < local_2c) && ((*min_degree_node == -1 || (local_2c < *min_degree)))) {
      *min_degree_node = node;
      *min_degree = local_2c;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_min_degree_node(REF_ADJ ref_adj, REF_INT *min_degree,
                                           REF_INT *min_degree_node) {
  REF_INT node, degree;
  *min_degree = REF_EMPTY;
  *min_degree_node = REF_EMPTY;

  for (node = 0; node < ref_adj_nnode(ref_adj); node++) {
    RSS(ref_adj_degree(ref_adj, node, &degree), "deg");
    if (degree > 0) {
      if (REF_EMPTY == (*min_degree_node) || degree < (*min_degree)) {
        *min_degree_node = node;
        *min_degree = degree;
      }
    }
  }

  return REF_SUCCESS;
}